

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,int64 value)

{
  int32 iVar1;
  int32 iVar2;
  uint64 size;
  int64 value_local;
  uint64 type_local;
  IMkvWriter *writer_local;
  
  if (writer == (IMkvWriter *)0x0) {
    writer_local._7_1_ = false;
  }
  else {
    iVar1 = WriteID(writer,type);
    if (iVar1 == 0) {
      iVar1 = GetIntSize(value);
      iVar2 = WriteUInt(writer,(long)iVar1);
      if (iVar2 == 0) {
        iVar1 = SerializeInt(writer,value,iVar1);
        if (iVar1 == 0) {
          writer_local._7_1_ = true;
        }
        else {
          writer_local._7_1_ = false;
        }
      }
      else {
        writer_local._7_1_ = false;
      }
    }
    else {
      writer_local._7_1_ = false;
    }
  }
  return writer_local._7_1_;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, int64 value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return 0;

  const uint64 size = GetIntSize(value);
  if (WriteUInt(writer, size))
    return false;

  if (SerializeInt(writer, value, static_cast<int32>(size)))
    return false;

  return true;
}